

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O3

void __thiscall YacclabTests::BlockSizeTest(YacclabTests *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  GlobalConfig *pGVar3;
  pointer pMVar4;
  pointer pdVar5;
  bool bVar6;
  char cVar7;
  path *ppVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  Labeling *pLVar9;
  undefined4 extraout_var;
  pointer pbVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  long *plVar14;
  ulong uVar15;
  ostream *poVar16;
  pointer pvVar17;
  ModeConfig *pMVar18;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  size_type *psVar21;
  _Base_ptr p_Var22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  key_type *__k;
  long lVar27;
  YacclabTests *this_01;
  long lVar28;
  int iVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dataset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  long lVar30;
  double dVar31;
  string filename;
  path is_path;
  string dataset_name;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> dims;
  path dataset_path;
  path filename_path;
  path current_latex_path;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  header;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  path current_output_path;
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  results;
  vector<double,_std::allocator<double>_> min_times;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  OutputBox ob;
  string local_510;
  string local_4f0;
  string local_4d0;
  ulong local_4b0;
  array<int,_3UL> *local_4a8;
  iterator iStack_4a0;
  array<int,_3UL> *local_498;
  path local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  _Base_ptr local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  long *local_438;
  long local_430;
  long local_428 [2];
  path local_418;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3d8;
  ulong local_3b8;
  allocator_type local_3b0 [32];
  undefined1 local_390 [40];
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  local_368;
  vector<double,_std::allocator<double>_> local_350 [2];
  undefined1 local_318 [8];
  size_type sStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [14];
  ios_base local_220 [264];
  ulong local_118;
  long local_110;
  Labeling *local_108;
  OutputBox local_e0;
  
  local_318 = (undefined1  [8])local_308;
  pcVar1 = (this->mode_cfg_->mode)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar1,pcVar1 + (this->mode_cfg_->mode)._M_string_length);
  std::__cxx11::string::append((char *)local_318);
  OutputBox::OutputBox(&local_e0,(string *)local_318,0x50,2);
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
  }
  pMVar18 = this->mode_cfg_;
  local_318 = (undefined1  [8])local_308;
  pcVar1 = (this->glob_cfg_->glob_output_path).path_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,pcVar1,
             pcVar1 + (this->glob_cfg_->glob_output_path).path_._M_string_length);
  ppVar8 = filesystem::path::operator/=((path *)local_318,&pMVar18->mode_output_path);
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Blocksize","");
  filesystem::path::path(&local_488,&local_4f0);
  local_318 = (undefined1  [8])local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_4d0._M_dataplus._M_p,
             local_4d0._M_dataplus._M_p + local_4d0._M_string_length);
  ppVar8 = filesystem::path::operator/=((path *)local_318,&local_488);
  local_390._0_8_ = local_390 + 0x10;
  pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_390,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.path_._M_dataplus._M_p != &local_488.path_.field_2) {
    operator_delete(local_488.path_._M_dataplus._M_p,
                    local_488.path_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = (array<int,_3UL> *)0x0;
  iStack_4a0._M_current = (array<int,_3UL> *)0x0;
  local_498 = (array<int,_3UL> *)0x0;
  pMVar18 = this->mode_cfg_;
  iVar23 = (pMVar18->blocksize_x)._M_elems[0];
  if (iVar23 <= (pMVar18->blocksize_x)._M_elems[1]) {
    do {
      for (iVar25 = (pMVar18->blocksize_y)._M_elems[0]; iVar25 <= (pMVar18->blocksize_y)._M_elems[1]
          ; iVar25 = iVar25 + (pMVar18->blocksize_y)._M_elems[2]) {
        iVar29 = (pMVar18->blocksize_z)._M_elems[0];
        if (iVar29 <= (pMVar18->blocksize_z)._M_elems[1]) {
          do {
            if (iVar25 * iVar23 * iVar29 < 1) {
              local_318._4_4_ = iVar25;
              local_318._0_4_ = iVar23;
              sStack_310 = CONCAT44(sStack_310._4_4_,iVar29);
              if (iStack_4a0._M_current == local_498) {
                std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>::
                _M_realloc_insert<std::array<int,3ul>>
                          ((vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>> *)
                           &local_4a8,iStack_4a0,(array<int,_3UL> *)local_318);
              }
              else {
                (iStack_4a0._M_current)->_M_elems[2] = iVar29;
                *(undefined1 (*) [8])(iStack_4a0._M_current)->_M_elems = local_318;
                iStack_4a0._M_current = iStack_4a0._M_current + 1;
              }
              pMVar18 = this->mode_cfg_;
            }
            iVar29 = iVar29 + (pMVar18->blocksize_z)._M_elems[2];
          } while (iVar29 <= (pMVar18->blocksize_z)._M_elems[1]);
        }
      }
      iVar23 = iVar23 + (pMVar18->blocksize_x)._M_elems[2];
    } while (iVar23 <= (pMVar18->blocksize_x)._M_elems[1]);
  }
  local_368.
  super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar10 = (pMVar18->ccl_blocksize_algorithms).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pMVar18->ccl_blocksize_algorithms).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar2) {
    do {
      __x = KernelMapSingleton::GetKernels(pbVar10);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&local_3f8,__x);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar2);
    pMVar18 = this->mode_cfg_;
    if ((pMVar18->ccl_blocksize_algorithms).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pMVar18->ccl_blocksize_algorithms).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var22 = (_Base_ptr)0x0;
      do {
        local_318 = (undefined1  [8])0x0;
        sStack_310 = 0;
        local_308[0]._M_allocated_capacity = 0;
        local_460 = p_Var22;
        if (local_3f8.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_3f8.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar24 = 0;
          do {
            local_488.path_._M_dataplus._M_p._0_4_ =
                 (int)((ulong)((long)iStack_4a0._M_current - (long)local_4a8) >> 2) * -0x55555555;
            local_4f0._M_dataplus._M_p._0_4_ =
                 (int)((ulong)((long)(this->mode_cfg_->average_datasets).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->mode_cfg_->average_datasets).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
            local_4d0._M_dataplus._M_p = (pointer)0x0;
            std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>::
            emplace_back<int,int,double>
                      ((vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>> *)local_318,
                       (int *)&local_488,(int *)&local_4f0,(double *)&local_4d0);
            uVar24 = uVar24 + 1;
          } while (uVar24 < (ulong)((long)local_3f8.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3f8.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::
        vector<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>,std::allocator<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>>
        ::emplace_back<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>
                  ((vector<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>,std::allocator<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>>
                    *)&local_368,
                   (vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> *)local_318);
        std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::~vector
                  ((vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> *)local_318);
        p_Var22 = (_Base_ptr)((long)&((_Rb_tree_node_base *)&local_460->_M_color)->_M_color + 1);
        pMVar18 = this->mode_cfg_;
      } while (p_Var22 < (_Base_ptr)
                         ((long)(pMVar18->ccl_blocksize_algorithms).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pMVar18->ccl_blocksize_algorithms).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  pbVar10 = (pMVar18->blocksize_datasets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pMVar18->blocksize_datasets).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
    local_3b8 = 0;
    do {
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      pcVar1 = pbVar10[local_3b8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d0,pcVar1,pcVar1 + pbVar10[local_3b8]._M_string_length);
      pGVar3 = this->glob_cfg_;
      filesystem::path::path((path *)&local_4f0,&local_4d0);
      pcVar1 = (pGVar3->input_path).path_._M_dataplus._M_p;
      local_318 = (undefined1  [8])local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_318,pcVar1,pcVar1 + (pGVar3->input_path).path_._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_318,(path *)&local_4f0);
      local_488.path_._M_dataplus._M_p = (pointer)&local_488.path_.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_488,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      filesystem::path::path(&local_418,&this->glob_cfg_->input_txt);
      local_318 = (undefined1  [8])local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_318,local_488.path_._M_dataplus._M_p,
                 local_488.path_._M_dataplus._M_p + local_488.path_._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_318,&local_418);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418.path_._M_dataplus._M_p != &local_418.path_.field_2) {
        operator_delete(local_418.path_._M_dataplus._M_p,
                        local_418.path_.field_2._M_allocated_capacity + 1);
      }
      pMVar18 = this->mode_cfg_;
      local_318 = (undefined1  [8])local_308;
      pcVar1 = (this->glob_cfg_->glob_output_path).path_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_318,pcVar1,
                 pcVar1 + (this->glob_cfg_->glob_output_path).path_._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_318,&pMVar18->mode_output_path);
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_510,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      pGVar3 = this->glob_cfg_;
      local_318 = (undefined1  [8])local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_318,local_510._M_dataplus._M_p,
                 local_510._M_dataplus._M_p + local_510._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_318,&pGVar3->latex_path);
      local_418.path_._M_dataplus._M_p = (pointer)&local_418.path_.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      this_01 = (YacclabTests *)local_390;
      bVar6 = filesystem::create_directories((path *)this_01);
      if (bVar6) {
        local_3d8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3d8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3d8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar6 = LoadFileList(this_01,&local_3d8,(path *)&local_4f0);
        if (bVar6) {
          OutputBox::StartUnitaryBox
                    (&local_e0,&local_4d0,
                     (ulong)(uint)((int)((ulong)((long)local_3d8.
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_3d8.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                  -0x33333333));
          if (local_3d8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_3d8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_110 = (long)(int)local_3b8;
            uVar24 = 0;
            do {
              ProgressBar::Display(&local_e0.pb,(uint)uVar24);
              local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
              pcVar1 = local_3d8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar24].first._M_dataplus._M_p;
              local_118 = uVar24;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_510,pcVar1,
                         pcVar1 + local_3d8.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar24].first.
                                  _M_string_length);
              filesystem::path::path((path *)&local_458,&local_510);
              local_318 = (undefined1  [8])local_308;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_318,local_488.path_._M_dataplus._M_p,
                         local_488.path_._M_dataplus._M_p + local_488.path_._M_string_length);
              ppVar8 = filesystem::path::operator/=((path *)local_318,(path *)&local_458);
              local_438 = local_428;
              pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_438,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
              if (local_318 != (undefined1  [8])local_308) {
                operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != &local_458.field_2) {
                operator_delete(local_458._M_dataplus._M_p,
                                local_458.field_2._M_allocated_capacity + 1);
              }
              pLVar9 = LabelingMapSingleton::GetLabeling
                                 ((this->mode_cfg_->ccl_blocksize_algorithms).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
              iVar23 = (*pLVar9->_vptr_Labeling[9])(pLVar9);
              local_318 = (undefined1  [8])local_308;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_318,local_438,local_430 + (long)local_438);
              cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar23) + 0x20))
                                ((long *)CONCAT44(extraout_var,iVar23),(string *)local_318);
              if (local_318 != (undefined1  [8])local_308) {
                operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
              }
              if (cVar7 == '\0') {
                std::operator+(&local_458,"Unable to open \'",&local_510);
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_458);
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 == paVar20) {
                  local_308[0]._0_8_ = paVar20->_M_allocated_capacity;
                  local_308[0]._8_8_ = plVar14[3];
                  local_318 = (undefined1  [8])local_308;
                }
                else {
                  local_308[0]._0_8_ = paVar20->_M_allocated_capacity;
                  local_318 = (undefined1  [8])*plVar14;
                }
                sStack_310 = plVar14[1];
                *plVar14 = (long)paVar20;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                OutputBox::Cmessage(&local_e0,(string *)local_318);
                if (local_318 != (undefined1  [8])local_308) {
                  operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                pbVar10 = (this->mode_cfg_->ccl_blocksize_algorithms).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((this->mode_cfg_->ccl_blocksize_algorithms).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
                  uVar24 = 0;
                  do {
                    local_318 = (undefined1  [8])local_308;
                    pcVar1 = pbVar10[uVar24]._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_318,pcVar1,pcVar1 + pbVar10[uVar24]._M_string_length)
                    ;
                    pLVar9 = LabelingMapSingleton::GetLabeling((string *)local_318);
                    if (iStack_4a0._M_current != local_4a8) {
                      this_00 = &(pLVar9->perf_).counters_;
                      local_460 = &(pLVar9->perf_).counters_._M_t._M_impl.super__Rb_tree_header.
                                   _M_header;
                      local_4b0 = 0;
                      uVar15 = uVar24;
                      local_390._32_8_ = uVar24;
                      local_108 = pLVar9;
                      do {
                        local_458._M_dataplus._M_p = (pointer)0x7fefffffffffffff;
                        std::vector<double,_std::allocator<double>_>::vector
                                  (local_350,
                                   (long)local_3f8.
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_3f8.
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5,
                                   (value_type_conflict5 *)&local_458,local_3b0);
                        if (this->mode_cfg_->blocksize_tests_number != 0) {
                          uVar26 = 0;
                          do {
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                            ::clear(&this_00->_M_t);
                            (*pLVar9->_vptr_Labeling[0xb])
                                      (pLVar9,(ulong)(uint)local_4a8[local_4b0]._M_elems[0],
                                       (ulong)(uint)local_4a8[local_4b0]._M_elems[1],
                                       (ulong)(uint)local_4a8[local_4b0]._M_elems[2]);
                            local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(local_468._4_4_,uVar26);
                            pbVar10 = local_3f8.
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            if (local_3f8.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
                              lVar30 = 0;
                              uVar24 = 0;
                              do {
                                __k = (key_type *)((long)&(pbVar10->_M_dataplus)._M_p + lVar30);
                                cVar11 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                                         ::find(&this_00->_M_t,__k);
                                pdVar5 = local_350[0].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                if (cVar11._M_node != local_460) {
                                  pmVar12 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                                            ::at(this_00,__k);
                                  dVar31 = pmVar12->total;
                                  if (pdVar5[uVar24] <= pmVar12->total) {
                                    dVar31 = pdVar5[uVar24];
                                  }
                                  local_350[0].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar24] = dVar31;
                                }
                                uVar24 = uVar24 + 1;
                                pbVar10 = local_3f8.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                lVar30 = lVar30 + 0x20;
                              } while (uVar24 < (ulong)((long)local_3f8.
                                                                                                                            
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pbVar10 >> 5));
                            }
                            pLVar9 = local_108;
                            (*local_108->_vptr_Labeling[5])(local_108);
                            uVar26 = (int)local_468 + 1;
                          } while (uVar26 < this->mode_cfg_->blocksize_tests_number);
                        }
                        uVar24 = local_390._32_8_;
                        lVar30 = (long)local_3f8.
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_3f8.
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        if (lVar30 == 0) {
                          if (local_350[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                          goto LAB_001f2ccb;
                        }
                        else {
                          lVar30 = lVar30 >> 5;
                          puVar19 = (undefined8 *)
                                    &(local_368.
                                      super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                      super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->field_0x48;
                          lVar27 = 0;
                          do {
                            lVar28 = *(long *)*puVar19 * (long)(int)local_4b0 + puVar19[-7];
                            *(double *)(lVar28 + local_110 * 8) =
                                 (double)(~-(ulong)(local_350[0].
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar27]
                                                  == 1.79769313486232e+308) &
                                         (ulong)local_350[0].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start[lVar27]) +
                                 *(double *)(lVar28 + local_110 * 8);
                            lVar27 = lVar27 + 1;
                            puVar19 = puVar19 + 0xc;
                          } while (lVar30 + (ulong)(lVar30 == 0) != lVar27);
LAB_001f2ccb:
                          operator_delete(local_350[0].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_350[0].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_350[0].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                        }
                        local_4b0 = (ulong)((int)local_4b0 + 1);
                        uVar13 = ((long)iStack_4a0._M_current - (long)local_4a8 >> 2) *
                                 -0x5555555555555555;
                        uVar15 = uVar24;
                      } while (local_4b0 <= uVar13 && uVar13 - local_4b0 != 0);
                    }
                    if (local_318 != (undefined1  [8])local_308) {
                      operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
                    }
                    uVar24 = (ulong)((int)uVar24 + 1);
                    pbVar10 = (this->mode_cfg_->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  } while (uVar24 < (ulong)((long)(this->mode_cfg_->ccl_blocksize_algorithms).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pbVar10 >> 5));
                }
              }
              if (local_438 != local_428) {
                operator_delete(local_438,local_428[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != &local_510.field_2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              uVar24 = (ulong)((int)local_118 + 1);
              uVar15 = ((long)local_3d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            } while (uVar24 <= uVar15 && uVar15 - uVar24 != 0);
          }
          ProgressBar::End(&local_e0.pb);
          OutputBox::PrintSeparatorLine(&local_e0);
        }
        else {
          local_438 = local_428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,local_4f0._M_dataplus._M_p,
                     local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
          plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x328d54);
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          psVar21 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar21) {
            local_510.field_2._M_allocated_capacity = *psVar21;
            local_510.field_2._8_8_ = plVar14[3];
          }
          else {
            local_510.field_2._M_allocated_capacity = *psVar21;
            local_510._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_510._M_string_length = plVar14[1];
          *plVar14 = (long)psVar21;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_510);
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 == paVar20) {
            local_308[0]._0_8_ = paVar20->_M_allocated_capacity;
            local_308[0]._8_8_ = plVar14[3];
            local_318 = (undefined1  [8])local_308;
          }
          else {
            local_308[0]._0_8_ = paVar20->_M_allocated_capacity;
            local_318 = (undefined1  [8])*plVar14;
          }
          sStack_310 = plVar14[1];
          *plVar14 = (long)paVar20;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          OutputBox::Cwarning(&local_e0,(string *)local_318,&local_4d0);
          if (local_318 != (undefined1  [8])local_308) {
            operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
          if (local_438 != local_428) {
            operator_delete(local_438,local_428[0] + 1);
          }
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::~vector(&local_3d8);
      }
      else {
        local_438 = local_428;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,local_390._0_8_,(pointer)(local_390._8_8_ + local_390._0_8_)
                  );
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x329694);
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        psVar21 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar21) {
          local_510.field_2._M_allocated_capacity = *psVar21;
          local_510.field_2._8_8_ = plVar14[3];
        }
        else {
          local_510.field_2._M_allocated_capacity = *psVar21;
          local_510._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_510._M_string_length = plVar14[1];
        *plVar14 = (long)psVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_510);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar20) {
          local_308[0]._0_8_ = paVar20->_M_allocated_capacity;
          local_308[0]._8_8_ = plVar14[3];
          local_318 = (undefined1  [8])local_308;
        }
        else {
          local_308[0]._0_8_ = paVar20->_M_allocated_capacity;
          local_318 = (undefined1  [8])*plVar14;
        }
        sStack_310 = plVar14[1];
        *plVar14 = (long)paVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        OutputBox::Cwarning(&local_e0,(string *)local_318,&local_4d0);
        if (local_318 != (undefined1  [8])local_308) {
          operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        if (local_438 != local_428) {
          operator_delete(local_438,local_428[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418.path_._M_dataplus._M_p != &local_418.path_.field_2) {
        operator_delete(local_418.path_._M_dataplus._M_p,
                        local_418.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488.path_._M_dataplus._M_p != &local_488.path_.field_2) {
        operator_delete(local_488.path_._M_dataplus._M_p,
                        local_488.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      local_3b8 = (ulong)((int)local_3b8 + 1);
      pMVar18 = this->mode_cfg_;
      pbVar10 = (pMVar18->blocksize_datasets).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_3b8 <
             (ulong)((long)(pMVar18->blocksize_datasets).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5));
  }
  pbVar10 = (pMVar18->ccl_blocksize_algorithms).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pMVar18->ccl_blocksize_algorithms).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
    local_468 = _VTT;
    local_4b0 = _operator__;
    p_Var22 = (_Base_ptr)0x0;
    do {
      pcVar1 = pbVar10[(long)p_Var22]._M_dataplus._M_p;
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_510,pcVar1,pcVar1 + pbVar10[(long)p_Var22]._M_string_length);
      std::__cxx11::string::append((char *)&local_510);
      filesystem::path::path(&local_418,&local_510);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d0,local_390._0_8_,(pointer)(local_390._8_8_ + local_390._0_8_));
      ppVar8 = filesystem::path::operator/=((path *)&local_4d0,&local_418);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      local_488.path_._M_dataplus._M_p = (pointer)&local_488.path_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_488,local_4f0._M_dataplus._M_p,
                 local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
      std::ofstream::ofstream((ostream *)local_318,(string *)&local_488,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488.path_._M_dataplus._M_p != &local_488.path_.field_2) {
        operator_delete(local_488.path_._M_dataplus._M_p,
                        local_488.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418.path_._M_dataplus._M_p != &local_418.path_.field_2) {
        operator_delete(local_418.path_._M_dataplus._M_p,
                        local_418.path_.field_2._M_allocated_capacity + 1);
      }
      local_460 = p_Var22;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,",,Kernel",8);
      p_Var22 = local_460;
      pbVar10 = local_3f8.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_460].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = local_3f8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_460].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar10 != pbVar2) {
        pMVar18 = this->mode_cfg_;
        do {
          if ((pMVar18->blocksize_datasets).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (pMVar18->blocksize_datasets).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar24 = 0;
            do {
              local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_318,(char *)&local_4d0,1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
              uVar24 = uVar24 + 1;
              pMVar18 = this->mode_cfg_;
            } while (uVar24 < (ulong)((long)(pMVar18->blocksize_datasets).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pMVar18->blocksize_datasets).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\nX,Y,Z",6);
      if (local_3f8.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3f8.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar24 = 0;
        pvVar17 = local_3f8.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pbVar2 = (this->mode_cfg_->blocksize_datasets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar10 = (this->mode_cfg_->blocksize_datasets).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
              pbVar10 = pbVar10 + 1) {
            local_4d0._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_4d0._M_dataplus._M_p >> 8);
            local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_318,(char *)&local_4d0,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
            pvVar17 = local_3f8.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < (ulong)((long)pvVar17[(long)p_Var22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)pvVar17[(long)p_Var22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"\n",1);
      if (iStack_4a0._M_current != local_4a8) {
        uVar24 = 0;
        do {
          poVar16 = (ostream *)
                    std::ostream::operator<<((ostream *)local_318,local_4a8[uVar24]._M_elems[0]);
          local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&local_4d0,1)
          ;
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_4a8[uVar24]._M_elems[1]);
          local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&local_4d0,1)
          ;
          std::ostream::operator<<(poVar16,local_4a8[uVar24]._M_elems[2]);
          if (local_3f8.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_3f8.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            pMVar18 = this->mode_cfg_;
            uVar15 = 0;
            pvVar17 = local_3f8.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((pMVar18->blocksize_datasets).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (pMVar18->blocksize_datasets).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar13 = 0;
                do {
                  local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_318,(char *)&local_4d0,1);
                  pMVar4 = local_368.
                           super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                           super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  std::ostream::_M_insert<double>
                            (*(double *)
                              (**(long **)&pMVar4[uVar15].field_0x48 * uVar24 +
                               *(long *)&pMVar4[uVar15].field_0x10 + uVar13 * 8));
                  uVar13 = uVar13 + 1;
                  pMVar18 = this->mode_cfg_;
                  pvVar17 = local_3f8.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (uVar13 < (ulong)((long)(pMVar18->blocksize_datasets).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pMVar18->blocksize_datasets).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < (ulong)((long)pvVar17[(long)p_Var22].
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar17[(long)p_Var22].
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          local_4d0._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_318,(char *)&local_4d0,1);
          uVar24 = uVar24 + 1;
          uVar15 = ((long)iStack_4a0._M_current - (long)local_4a8 >> 2) * -0x5555555555555555;
        } while (uVar24 <= uVar15 && uVar15 - uVar24 != 0);
      }
      local_318 = (undefined1  [8])local_468;
      *(ulong *)(local_318 + *(long *)(local_468->_M_local_buf + -0x18)) = local_4b0;
      std::filebuf::~filebuf((filebuf *)&sStack_310);
      std::ios_base::~ios_base(local_220);
      p_Var22 = (_Base_ptr)((long)&((_Rb_tree_node_base *)&local_460->_M_color)->_M_color + 1);
      pbVar10 = (this->mode_cfg_->ccl_blocksize_algorithms).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (p_Var22 < (_Base_ptr)
                       ((long)(this->mode_cfg_->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5));
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_3f8);
  std::
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ::~vector(&local_368);
  if (local_4a8 != (array<int,_3UL> *)0x0) {
    operator_delete(local_4a8,(long)local_498 - (long)local_4a8);
  }
  if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
    operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.pre_message_._M_dataplus._M_p != &local_e0.pb.pre_message_.field_2) {
    operator_delete(local_e0.pb.pre_message_._M_dataplus._M_p,
                    local_e0.pb.pre_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.post_message_._M_dataplus._M_p != &local_e0.pb.post_message_.field_2) {
    operator_delete(local_e0.pb.post_message_._M_dataplus._M_p,
                    local_e0.pb.post_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.title_._M_dataplus._M_p != &local_e0.title_.field_2) {
    operator_delete(local_e0.title_._M_dataplus._M_p,
                    local_e0.title_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void YacclabTests::BlockSizeTest() {
    OutputBox ob(mode_cfg_.mode + " Block Size Test");

    path current_output_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / path("Blocksize"));

    // Create vector of dims (arrays of three int)
    int maxsize = 0;

#if defined YACCLAB_WITH_CUDA
    cudaDeviceProp prop;
    cudaGetDeviceProperties(&prop, 0);
    maxsize = prop.maxThreadsPerBlock;
#endif

    std::vector<std::array<int, 3>> dims;

    for (int x = mode_cfg_.blocksize_x[0]; x <= mode_cfg_.blocksize_x[1]; x += mode_cfg_.blocksize_x[2]) {
        for (int y = mode_cfg_.blocksize_y[0]; y <= mode_cfg_.blocksize_y[1]; y += mode_cfg_.blocksize_y[2]) {
            for (int z = mode_cfg_.blocksize_z[0]; z <= mode_cfg_.blocksize_z[1]; z += mode_cfg_.blocksize_z[2]) {
                if (x * y * z <= maxsize) {
                    dims.push_back({ x, y, z });
                }
            }
        }
    }

    std::vector<std::vector<cv::Mat1d>> results;					// One dims x datasets matrix for each kernel for each algorithm
    std::vector<std::vector<std::string>> header;					// Kernel names for each algorithm
    for (const auto& algo_name : mode_cfg_.ccl_blocksize_algorithms) {

        const auto& kernels = KernelMapSingleton::GetKernels(algo_name);
        header.push_back(kernels);

    }

    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {
        std::vector<cv::Mat1d> tmp;

        for (int k = 0; k < header[alg].size(); ++k) {
            tmp.emplace_back(static_cast<int>(dims.size()), static_cast<int>(mode_cfg_.average_datasets.size()), (double)0);
        }

        results.push_back(std::move(tmp));
    }

    for (unsigned d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) { // For every dataset in the average list

        std::string dataset_name(mode_cfg_.blocksize_datasets[d]);

        path dataset_path(glob_cfg_.input_path / path(dataset_name)),
            is_path = dataset_path / path(glob_cfg_.input_txt), // files.txt path
            current_latex_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / glob_cfg_.latex_path);

        if (!create_directories(current_output_path)) {
            ob.Cwarning("Unable to find/create the output path '" + current_output_path.string() + "', skipped", dataset_name);
            continue;
        }

        // To save list of filename on which CLLAlgorithms must be tested
        std::vector<std::pair<std::string, bool>> filenames;  // first: filename, second: state of filename (find or not)
        if (!LoadFileList(filenames, is_path)) {
            ob.Cwarning("Unable to open '" + is_path.string() + "', skipped", dataset_name);
            continue;
        }

        // Number of files
        unsigned filenames_size = static_cast<unsigned>(filenames.size());

        // Start output message box
        ob.StartUnitaryBox(dataset_name, filenames_size);

        for (unsigned file = 0; file < filenames.size(); ++file) {

            ob.UpdateUnitaryBox(file);

            std::string filename = filenames[file].first;
            path filename_path = dataset_path / path(filename);

            // Read and load image
            if (!LabelingMapSingleton::GetLabeling(mode_cfg_.ccl_blocksize_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
                ob.Cmessage("Unable to open '" + filename + "', skipped");
                continue;
            }

            for (unsigned alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

                std::string algo_name = mode_cfg_.ccl_blocksize_algorithms[alg];

                Labeling* algorithm = LabelingMapSingleton::GetLabeling(algo_name);

                for (unsigned dim = 0; dim < dims.size(); ++dim) {

                    std::vector<double> min_times(header[alg].size(), std::numeric_limits<double>::max());

                    for (unsigned it = 0; it < mode_cfg_.blocksize_tests_number; ++it) {

                        try {
                            // Perform current algorithm on current image and save result.
                            algorithm->perf_.reset_counters();
                            algorithm->PerformLabelingBlocksize(dims[dim][0], dims[dim][1], dims[dim][2]);
                        }
                        catch (const std::exception& e) {
                            algorithm->FreeLabelingData();
                            ob.Cerror("Something wrong with " + algo_name + ": " + e.what()); // You should check your algorithms' implementation before performing YACCLAB tests  
                        }

                        for (int k = 0; k < header[alg].size(); ++k) {
                            const auto& kernel = header[alg][k];

                            if (algorithm->perf_.find(kernel)) {
                                min_times[k] = std::min(min_times[k], algorithm->perf_.get_total(kernel));
                            }
                        }

                        algorithm->FreeLabelingData();
                    }

                    // For each image, execution times are summed, in order to find average
                    for (int k = 0; k < header[alg].size(); ++k) {
                        // If min time is DBL_MAX, the kernel was never run
                        results[alg][k](dim, d) += (min_times[k] == std::numeric_limits<double>::max() ? 0 : min_times[k]);
                    }

                }

            }

        } // END IMAGE FOR
        ob.StopUnitaryBox();

        // TODO: decide if values should be averaged (they are just summed for now)
        //for (auto& result_mat : results) {
        //	result_mat /= static_cast<double>(filenames.size());
        //}

    } // END DATASET FOR

    
    // Print results
    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

        {   // To automatically destroy ofstream os

            std::ofstream os((current_output_path / path(mode_cfg_.ccl_blocksize_algorithms[alg] + ".csv")).string());

            os << ",,Kernel";
            for (const auto& kernel : header[alg]) {
                for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                    os << ',' << kernel;
                }
            }
            os << "\nX,Y,Z";

            for (int k = 0; k < header[alg].size(); ++k) {
                for (const auto& dataset : mode_cfg_.blocksize_datasets) {
                    os << ',' << dataset;
                }
            }
            os << "\n";

            for (int dim = 0; dim < dims.size(); ++dim) {
                os << dims[dim][0] << ',' << dims[dim][1] << ',' << dims[dim][2];
                for (int k = 0; k < header[alg].size(); ++k) {
                    for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                        os << ',' << results[alg][k](dim, d);
                    }
                }
                os << '\n';
            }

        }
    }

}